

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symlink.cpp
# Opt level: O2

string * fs_read_symlink_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  string_view path_00;
  string_view fname;
  error_code ec;
  string_view path_local;
  path p;
  path local_48;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  ec._M_cat = (error_category *)std::_V2::generic_category();
  ec._M_value = 0x16;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_48,&path_local,auto_format);
  std::filesystem::read_symlink(&p,(error_code *)&local_48);
  std::filesystem::__cxx11::path::~path(&local_48);
  if (ec._M_value == 0) {
    std::filesystem::__cxx11::path::generic_string(__return_storage_ptr__,&p);
    std::filesystem::__cxx11::path::~path(&p);
  }
  else {
    std::filesystem::__cxx11::path::~path(&p);
    path_00._M_str = path_local._M_str;
    path_00._M_len = path_local._M_len;
    fname._M_str = "fs_read_symlink";
    fname._M_len = 0xf;
    fs_print_error(path_00,fname,&ec);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_read_symlink(std::string_view path)
{
  // read the target of a symlink

  std::error_code ec = std::make_error_code(std::errc::invalid_argument);

#if defined(__MINGW32__) || (defined(_WIN32) && !defined(HAVE_CXX_FILESYSTEM))
  if(fs_is_symlink(path))
    return fs_win32_final_path(path);
#elif defined(HAVE_CXX_FILESYSTEM)
  if(auto p = std::filesystem::read_symlink(path, ec); !ec) FFS_LIKELY
    return p.generic_string();
#else
  // https://www.man7.org/linux/man-pages/man2/readlink.2.html
  std::string r(fs_get_max_path(), '\0');

  if (ssize_t Lr = readlink(path.data(), r.data(), r.size()); Lr > 0){
    // readlink() does not null-terminate the result
    r.resize(Lr);
    return r;
  }
#endif

  fs_print_error(path, __func__, ec);
  return {};
}